

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

_Bool menu_handle_mouse(menu_conflict *menu,ui_event *in,ui_event *out)

{
  region_conflict *loc;
  bool bVar1;
  _Bool _Var2;
  int cursor;
  int *piVar3;
  _func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *p_Var4;
  byte bVar5;
  
  if ((in->mouse).button == '\x02') {
LAB_001f5cd8:
    out->type = EVT_ESCAPE;
  }
  else {
    loc = &menu->active;
    _Var2 = region_inside((region *)loc,in);
    if (_Var2) {
      piVar3 = &menu->filter_count;
      if (menu->filter_list == (int *)0x0) {
        piVar3 = &menu->count;
      }
      cursor = (*menu->skin->get_cursor)
                         ((int)(in->mouse).y,(int)(in->mouse).x,*piVar3,menu->top,loc);
      _Var2 = is_valid_row(menu,cursor);
      if (_Var2) {
        p_Var4 = (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)0x40;
        if (cursor != menu->cursor) {
          p_Var4 = (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)
                   (ulong)((uint)((menu->flags & 0x10) == 0) * 0x20 + 0x20);
        }
        out->type = (ui_event_type)p_Var4;
        menu->cursor = cursor;
LAB_001f5dc7:
        bVar5 = (byte)p_Var4;
        bVar1 = true;
      }
      else {
        p_Var4 = menu->context_hook;
        if (p_Var4 == (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)0x0)
        goto LAB_001f5dc7;
        bVar5 = (*p_Var4)(menu,in,out);
        bVar1 = false;
      }
      if (!bVar1) goto LAB_001f5ce4;
    }
    else {
      _Var2 = region_inside((region *)loc,in);
      if ((!_Var2) && ((int)(uint)(in->mouse).x < loc->col)) goto LAB_001f5cd8;
      if (menu->context_hook != (_func__Bool_menu_ptr_ui_event_ptr_ui_event_ptr_conflict *)0x0) {
        _Var2 = (*menu->context_hook)(menu,in,out);
        return _Var2;
      }
    }
  }
  bVar5 = out->type != EVT_NONE;
LAB_001f5ce4:
  return (_Bool)(bVar5 & 1);
}

Assistant:

bool menu_handle_mouse(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	int new_cursor;

	if (in->mouse.button == 2) {
		out->type = EVT_ESCAPE;
	} else if (!region_inside(&menu->active, in)) {
		/* A click to the left of the active region is 'back' */
		if (!region_inside(&menu->active, in)
				&& in->mouse.x < menu->active.col) {
			out->type = EVT_ESCAPE;
		} else if (menu->context_hook) {
			return (*menu->context_hook)(menu, in, out);
		}
	} else {
		int count = menu->filter_list ? menu->filter_count : menu->count;

		new_cursor = menu->skin->get_cursor(in->mouse.y, in->mouse.x,
				count, menu->top, &menu->active);
	
		if (is_valid_row(menu, new_cursor)) {
			if (new_cursor == menu->cursor || !(menu->flags & MN_DBL_TAP))
				out->type = EVT_SELECT;
			else
				out->type = EVT_MOVE;

			menu->cursor = new_cursor;
		} else if (menu->context_hook) {
			return (*menu->context_hook)(menu, in, out);
		}
	}

	return out->type != EVT_NONE;
}